

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O2

void __thiscall QCborStreamReader::reparse(QCborStreamReader *this)

{
  QCborStreamReaderPrivate *this_00;
  long lVar1;
  CborError CVar2;
  
  this_00 = *(QCborStreamReaderPrivate **)(this + 8);
  (this_00->lastError).c = NoError;
  QCborStreamReaderPrivate::preread(this_00);
  if ((*(byte *)(*(long *)(this + 8) + 0x5f) & 8) == 0) {
    CVar2 = preparse_next_value_nodecrement((CborValue *)(*(long *)(this + 8) + 0x48));
    if (CVar2 != CborNoError) {
      lVar1 = *(long *)(this + 8);
      if (CVar2 != CborErrorUnexpectedEOF) {
        *(undefined1 *)(lVar1 + 0x70) = 1;
      }
      *(CborError *)(lVar1 + 0x60) = CVar2;
      return;
    }
  }
  preparse(this);
  return;
}

Assistant:

void QCborStreamReader::reparse()
{
    d->lastError = {};
    d->preread();
    if (CborError err = cbor_value_reparse(&d->currentElement))
        d->handleError(err);
    else
        preparse();
}